

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::TestSpec::Filter::name_abi_cxx11_(string *__return_storage_ptr__,Filter *this)

{
  bool bVar1;
  __shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  string *psVar2;
  shared_ptr<Catch::TestSpec::Pattern> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  Filter *this_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ::begin(&this->m_patterns);
  p = (shared_ptr<Catch::TestSpec::Pattern> *)
      std::
      vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
      ::end(&this->m_patterns);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
                                     *)&p), bVar1) {
    this_00 = (__shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
                 ::operator*(&__end1);
    this_01 = std::
              __shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    psVar2 = Pattern::name_abi_cxx11_(this_01);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar2);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestSpec::Filter::name() const {
        std::string name;
        for( auto const& p : m_patterns )
            name += p->name();
        return name;
    }